

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O0

ValueType __thiscall
nanovdb::
InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
::getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
          (InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>
           *this,CoordType *ijk,ReadAccessor<float,_0,_1,_2> *acc)

{
  bool bVar1;
  uint32_t n_00;
  CoordType *in_RDX;
  InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U> *in_RSI;
  InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U> *in_RDI;
  ValueType VVar2;
  ReadAccessor<float,_0,_1,_2> *unaff_retaddr;
  InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U> *child;
  uint32_t n;
  InternalData<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>
  *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U> *node;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  node = in_RDI;
  n_00 = InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>
         ::CoordToOffset((CoordType *)in_stack_ffffffffffffffd0);
  bVar1 = Mask<5U>::isOn((Mask<5U> *)
                         ((in_RDI->
                          super_InternalData<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>
                          ).mTable + 0x17c),n_00);
  if (bVar1) {
    InternalData<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>
    ::getChild(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_RDI >> 0x20));
    ReadAccessor<float,0,1,2>::
    insert<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>>
              (unaff_retaddr,
               (CoordType *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),node);
    VVar2 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
            getValueAndCache<nanovdb::ReadAccessor<float,0,1,2>>
                      (in_RSI,in_RDX,
                       (ReadAccessor<float,_0,_1,_2> *)CONCAT44(n_00,in_stack_ffffffffffffffd8));
  }
  else {
    VVar2 = (in_RDI->
            super_InternalData<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>).
            mTable[(ulong)n_00 + 0x380].value;
  }
  return VVar2;
}

Assistant:

__hostdev__ ValueType getValueAndCache(const CoordType& ijk, const AccT& acc) const
    {
        const uint32_t n = CoordToOffset(ijk);
        if (!DataType::mChildMask.isOn(n))
            return DataType::mTable[n].value;
        const ChildT* child = this->getChild(n);
        acc.insert(ijk, child);
        return child->getValueAndCache(ijk, acc);
    }